

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

bool __thiscall helics::TimeDependencies::hasActiveTimeDependencies(TimeDependencies *this)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_RDI;
  
  cVar2 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                    (in_RDI);
  cVar3 = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end(in_RDI);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<helics::DependencyInfo_const*,std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>>,helics::TimeDependencies::hasActiveTimeDependencies()const::__0>
                    (cVar2._M_current,cVar3._M_current);
  return bVar1;
}

Assistant:

bool TimeDependencies::hasActiveTimeDependencies() const
{
    return std::any_of(dependencies.begin(), dependencies.end(), [](const auto& dep) {
        return (dep.dependency && (dep.fedID.isFederate()) && (dep.next < cBigTime));
    });
}